

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O3

Button __thiscall QtMWidgets::StepperPrivate::buttonPressed(StepperPrivate *this,QPoint *pos)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  Button BVar4;
  int iVar5;
  int iVar6;
  QRect plus;
  QRect minus;
  QPoint local_28;
  undefined8 local_20;
  QPoint local_18;
  int local_10;
  int iStack_c;
  
  lVar1 = *(long *)&this->q->field_0x20;
  iVar5 = *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14);
  iVar6 = *(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18);
  local_20 = CONCAT44(iVar6,iVar5);
  local_18.xp = 0;
  local_18.yp = 0;
  local_28.xp = (iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1;
  _local_10 = CONCAT44(iVar6,local_28.xp - 1);
  local_28.yp = 0;
  cVar2 = QRect::contains(&local_18,SUB81(pos,0));
  BVar4 = Minus;
  if (cVar2 == '\0') {
    bVar3 = QRect::contains(&local_28,SUB81(pos,0));
    BVar4 = (uint)bVar3 * 2;
  }
  return BVar4;
}

Assistant:

StepperPrivate::Button
StepperPrivate::buttonPressed( const QPoint & pos )
{
	QRect minus = q->rect();
	minus.setRight( minus.left() + minus.width() / 2 - 1 );
	QRect plus = q->rect();
	plus.setLeft( minus.right() + 1 );

	if( minus.contains( pos ) )
		return Minus;
	else if( plus.contains( pos ) )
		return Plus;
	else
		return NoButton;
}